

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O1

Vec3fa __thiscall
embree::CoronaLoader::load<embree::Vec3fa>(CoronaLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  undefined4 uVar1;
  undefined4 uVar3;
  runtime_error *this_01;
  long *plVar4;
  long *plVar5;
  long *in_RDX;
  undefined4 extraout_XMM0_Db;
  Vec3fa VVar6;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  float local_68;
  float local_58;
  string local_40;
  undefined1 auVar2 [16];
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (2 < (ulong)((*(long *)(*in_RDX + 0xa0) - (long)this_00 >> 3) * -0x71c71c71c71c71c7)) {
    local_58 = Token::Float(this_00,true);
    local_68 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    VVar6.field_0._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    uVar3 = local_68;
    uVar1 = local_58;
    auVar2._0_8_ = CONCAT44(uVar3,uVar1);
    auVar2._8_4_ = VVar6.field_0._0_4_;
    auVar2._12_4_ = 0;
    (this->path).filename._M_dataplus = (_Alloc_hider)auVar2._0_8_;
    (this->path).filename._M_string_length = auVar2._8_8_;
    VVar6.field_0.m128[1] = (float)extraout_XMM0_Db;
    VVar6.field_0.m128[2] = VVar6.field_0._0_4_;
    VVar6.field_0.m128[3] = 0.0;
    return (Vec3fa)VVar6.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,(ParseLocation *)(*in_RDX + 0x10));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_88 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_88 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar4[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
  }
  local_80 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_88);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3fa CoronaLoader::load<Vec3fa>(const Ref<XML>& xml) {
    if (xml->body.size() < 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }